

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SetString
          (Reflection *this,Message *message,FieldDescriptor *field,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ReflectionSchema *this_00;
  byte bVar2;
  FieldType type;
  int number;
  Descriptor *pDVar3;
  bool bVar4;
  CppStringType CVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  InlinedStringField *pIVar8;
  string *this_01;
  OneofDescriptor *pOVar9;
  ArenaStringPtr *pAVar10;
  Cord *pCVar11;
  Cord **ppCVar12;
  ArenaStringPtr *extraout_RAX;
  char *description;
  Arena *extraout_RDX;
  Arena *pAVar13;
  pointer pcVar14;
  size_type sVar15;
  string_view src;
  Metadata MVar16;
  undefined1 local_68 [24];
  __atomic_base<long> local_50;
  atomic<google::protobuf::internal::ThreadSafeArena::SerialArenaChunk_*> local_48;
  void *local_40;
  atomic<char_*> aStack_38;
  
  pAVar13 = (Arena *)local_68;
  MVar16 = Message::GetMetadata(message);
  if (MVar16.reflection != this) {
    pDVar3 = this->descriptor_;
    MVar16 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar3,MVar16.descriptor,field,"SetString");
  }
  pDVar3 = this->descriptor_;
  if (field->containing_type_ != pDVar3) {
    description = "Field does not match message type.";
LAB_001f258b:
    anon_unknown_6::ReportReflectionUsageError(pDVar3,field,"SetString",description);
  }
  bVar2 = field->field_0x1;
  if (0xbf < bVar2 != (bool)((bVar2 & 0x20) >> 5)) {
    SetString();
LAB_001f2505:
    SetString();
    pAVar10 = extraout_RAX;
    pAVar13 = extraout_RDX;
LAB_001f250d:
    pAVar13 = *(Arena **)((ulong)pAVar13 & 0xfffffffffffffffe);
LAB_001f2420:
    internal::ArenaStringPtr::Set(pAVar10,value,pAVar13);
    return;
  }
  if ((bVar2 & 0x20) != 0) {
    description = "Field is repeated; the method requires a singular field.";
    goto LAB_001f258b;
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
    anon_unknown_6::ReportReflectionUsageTypeError(pDVar3,field,"SetString",CPPTYPE_STRING);
  }
  if ((bVar2 & 8) != 0) {
    uVar7 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    number = field->number_;
    type = field->type_;
    local_50._M_i = (__int_type)(value->_M_dataplus)._M_p;
    paVar1 = &value->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_i == paVar1) {
      local_40 = (void *)paVar1->_M_allocated_capacity;
      aStack_38._M_b._M_p = *(__base_type *)((long)&value->field_2 + 8);
      local_50._M_i = (__int_type)&local_40;
    }
    else {
      local_40 = (void *)paVar1->_M_allocated_capacity;
    }
    local_48._M_b._M_p = (__base_type)value->_M_string_length;
    (value->_M_dataplus)._M_p = (pointer)paVar1;
    value->_M_string_length = 0;
    (value->field_2)._M_local_buf[0] = '\0';
    this_01 = internal::ExtensionSet::MutableString_abi_cxx11_
                        ((ExtensionSet *)
                         ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar7),
                         number,type,field);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_50);
    if ((void **)local_50._M_i != &local_40) {
      operator_delete((void *)local_50._M_i,(long)local_40 + 1);
    }
    return;
  }
  CVar5 = FieldDescriptor::cpp_string_type(field);
  if ((CVar5 == kView) || (CVar5 == kString)) {
    this_00 = &this->schema_;
    bVar4 = internal::ReflectionSchema::IsFieldInlined(this_00,field);
    if (!bVar4) {
      bVar4 = internal::ReflectionSchema::InRealOneof(this_00,field);
      if (bVar4) {
        if ((field->field_0x1 & 0x10) == 0) {
          pOVar9 = (OneofDescriptor *)0x0;
        }
        else {
          pOVar9 = (field->scope_).containing_oneof;
          if (pOVar9 == (OneofDescriptor *)0x0) goto LAB_001f25a7;
        }
        uVar7 = GetOneofCase(this,message,pOVar9);
        if (uVar7 != field->number_) {
          pOVar9 = FieldDescriptor::containing_oneof(field);
          ClearOneof(this,message,pOVar9);
          pAVar10 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,field);
          (pAVar10->tagged_ptr_).ptr_ = &internal::fixed_address_empty_string;
        }
      }
      pAVar10 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,field);
      pAVar13 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pAVar13 & 1) == 0) goto LAB_001f2420;
      goto LAB_001f250d;
    }
    uVar7 = internal::ReflectionSchema::InlinedStringIndex(this_00,field);
    if (uVar7 == 0) goto LAB_001f2505;
    if ((this->schema_).inlined_string_donated_offset_ == -1) {
      SetString();
LAB_001f2521:
      SetString();
    }
    else {
      internal::ReflectionSchema::InlinedStringDonatedOffset(this_00);
      pIVar8 = MutableField<google::protobuf::internal::InlinedStringField>(this,message,field);
      local_68._16_8_ = (value->_M_dataplus)._M_p;
      value = (string *)value->_M_string_length;
      uVar7 = internal::ReflectionSchema::InlinedStringIndex(this_00,field);
      if (uVar7 == 0) goto LAB_001f2521;
      if ((this->schema_).inlined_string_donated_offset_ != -1) {
        uVar6 = internal::ReflectionSchema::InlinedStringDonatedOffset(this_00);
        anon_unknown_6::IsIndexInHasBitSet
                  ((uint32_t *)
                   ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6),uVar7);
        std::__cxx11::string::_M_replace
                  ((ulong)pIVar8,0,(char *)(pIVar8->field_0).str_._M_string_length,local_68._16_8_);
        return;
      }
    }
    SetString();
LAB_001f2531:
    pAVar13 = *(Arena **)((ulong)pAVar13 & 0xfffffffffffffffe);
LAB_001f2488:
    if (pAVar13 == (Arena *)0x0) {
      pCVar11 = (Cord *)operator_new(0x10);
    }
    else {
      pCVar11 = (Cord *)Arena::AllocateAlignedWithCleanup
                                  (pAVar13,0x10,8,
                                   internal::cleanup::
                                   arena_destruct_object<absl::lts_20250127::Cord>);
    }
    (pCVar11->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
    (pCVar11->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
    ppCVar12 = MutableField<absl::lts_20250127::Cord*>(this,message,field);
    *ppCVar12 = pCVar11;
  }
  else {
    if (CVar5 != kCord) {
      return;
    }
    bVar4 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
    if (!bVar4) {
      pcVar14 = (value->_M_dataplus)._M_p;
      sVar15 = value->_M_string_length;
      pCVar11 = MutableField<absl::lts_20250127::Cord>(this,message,field);
      goto LAB_001f24d9;
    }
    if ((field->field_0x1 & 0x10) == 0) {
      pOVar9 = (OneofDescriptor *)0x0;
    }
    else {
      pOVar9 = (field->scope_).containing_oneof;
      if (pOVar9 == (OneofDescriptor *)0x0) goto LAB_001f25a7;
    }
    uVar7 = GetOneofCase(this,message,pOVar9);
    if (uVar7 != field->number_) {
      if ((field->field_0x1 & 0x10) == 0) {
        pOVar9 = (OneofDescriptor *)0x0;
      }
      else {
        pOVar9 = (field->scope_).containing_oneof;
        if (pOVar9 == (OneofDescriptor *)0x0) {
LAB_001f25a7:
          internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb31);
        }
      }
      ClearOneof(this,message,pOVar9);
      pAVar13 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pAVar13 & 1) != 0) goto LAB_001f2531;
      goto LAB_001f2488;
    }
  }
  pcVar14 = (value->_M_dataplus)._M_p;
  sVar15 = value->_M_string_length;
  ppCVar12 = MutableField<absl::lts_20250127::Cord*>(this,message,field);
  pCVar11 = *ppCVar12;
LAB_001f24d9:
  src._M_str = pcVar14;
  src._M_len = sVar15;
  absl::lts_20250127::Cord::operator=(pCVar11,src);
  return;
}

Assistant:

void Reflection::SetString(Message* message, const FieldDescriptor* field,
                           std::string value) const {
  USAGE_MUTABLE_CHECK_ALL(SetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return MutableExtensionSet(message)->SetString(
        field->number(), field->type(), std::move(value), field);
  } else {
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        if (schema_.InRealOneof(field)) {
          if (!HasOneofField(*message, field)) {
            ClearOneof(message, field->containing_oneof());
            *MutableField<absl::Cord*>(message, field) =
                Arena::Create<absl::Cord>(message->GetArena());
          }
          *(*MutableField<absl::Cord*>(message, field)) = value;
          break;
        }
        *MutableField<absl::Cord>(message, field) = value;
        break;
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString: {
        if (IsInlined(field)) {
          const uint32_t index = schema_.InlinedStringIndex(field);
          ABSL_DCHECK_GT(index, 0u);
          uint32_t* states =
              &MutableInlinedStringDonatedArray(message)[index / 32];
          uint32_t mask = ~(static_cast<uint32_t>(1) << (index % 32));
          MutableField<InlinedStringField>(message, field)
              ->Set(value, message->GetArena(),
                    IsInlinedStringDonated(*message, field), states, mask,
                    message);
          break;
        } else if (IsMicroString(field)) {
          if (schema_.InRealOneof(field) && !HasOneofField(*message, field)) {
            ClearOneof(message, field->containing_oneof());
            MutableField<MicroString>(message, field)->InitDefault();
          }
          MutableField<MicroString>(message, field)
              ->Set(std::move(value), message->GetArena());
          break;
        }

        // Oneof string fields are never set as a default instance.
        // We just need to pass some arbitrary default string to make it work.
        // This allows us to not have the real default accessible from
        // reflection.
        if (schema_.InRealOneof(field) && !HasOneofField(*message, field)) {
          ClearOneof(message, field->containing_oneof());
          MutableField<ArenaStringPtr>(message, field)->InitDefault();
        }
        MutableField<ArenaStringPtr>(message, field)
            ->Set(std::move(value), message->GetArena());
        break;
      }
    }
  }
}